

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# register_allocation.cpp
# Opt level: O2

void __thiscall
mocker::detail::RegisterAllocator::color(RegisterAllocator *this,RegMap<Node> *coloring)

{
  Line *__args;
  const_iterator cVar1;
  Section *pSVar2;
  bool bVar3;
  bool bVar4;
  __type _Var5;
  iterator iVar6;
  _List_node_base *p_Var7;
  shared_ptr<mocker::nasm::Register> src;
  shared_ptr<mocker::nasm::Mov> p;
  list<mocker::nasm::Line,_std::allocator<mocker::nasm::Line>_> insts;
  shared_ptr<mocker::nasm::Register> dest;
  shared_ptr<mocker::nasm::Inst> newInst;
  __shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2> local_70;
  Line local_60;
  
  insts.super__List_base<mocker::nasm::Line,_std::allocator<mocker::nasm::Line>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)&insts;
  insts.super__List_base<mocker::nasm::Line,_std::allocator<mocker::nasm::Line>_>._M_impl._M_node.
  _M_size = 0;
  p_Var7 = (this->funcBeg)._M_node;
  insts.super__List_base<mocker::nasm::Line,_std::allocator<mocker::nasm::Line>_>._M_impl._M_node.
  super__List_node_base._M_prev =
       insts.super__List_base<mocker::nasm::Line,_std::allocator<mocker::nasm::Line>_>._M_impl.
       _M_node.super__List_node_base._M_next;
  do {
    cVar1._M_node = (this->funcEnd)._M_node;
    if (p_Var7 == cVar1._M_node) {
      iVar6 = std::__cxx11::list<mocker::nasm::Line,_std::allocator<mocker::nasm::Line>_>::erase
                        (&this->section->lines,(this->funcBeg)._M_node,cVar1);
      (this->funcEnd)._M_node = iVar6._M_node;
      (this->funcBeg)._M_node = iVar6._M_node;
      (this->funcBeg)._M_node = (iVar6._M_node)->_M_prev;
      p_Var7 = (_List_node_base *)&insts;
      while (p_Var7 = (((_List_base<mocker::nasm::Line,_std::allocator<mocker::nasm::Line>_> *)
                       &p_Var7->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
            p_Var7 != (_List_node_base *)&insts) {
        pSVar2 = this->section;
        cVar1._M_node = (this->funcEnd)._M_node;
        nasm::Line::Line(&local_60,(Line *)(p_Var7 + 1));
        std::__cxx11::list<mocker::nasm::Line,_std::allocator<mocker::nasm::Line>_>::
        emplace<mocker::nasm::Line>(&pSVar2->lines,cVar1,&local_60);
        nasm::Line::~Line(&local_60);
      }
      (this->funcBeg)._M_node = ((this->funcBeg)._M_node)->_M_next;
      std::__cxx11::_List_base<mocker::nasm::Line,_std::allocator<mocker::nasm::Line>_>::_M_clear
                (&insts.super__List_base<mocker::nasm::Line,_std::allocator<mocker::nasm::Line>_>);
      return;
    }
    __args = (Line *)(p_Var7 + 1);
    if (p_Var7[3]._M_next == (_List_node_base *)0x0) {
      std::__cxx11::list<mocker::nasm::Line,std::allocator<mocker::nasm::Line>>::
      emplace_back<mocker::nasm::Line_const&>
                ((list<mocker::nasm::Line,std::allocator<mocker::nasm::Line>> *)&insts,__args);
    }
    else {
      nasm::replaceRegs((nasm *)&newInst,(shared_ptr<mocker::nasm::Inst> *)(p_Var7 + 3),coloring);
      std::dynamic_pointer_cast<mocker::nasm::Mov,mocker::nasm::Inst>
                ((shared_ptr<mocker::nasm::Inst> *)&p);
      if (p.super___shared_ptr<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (element_type *)0x0) {
LAB_0012e55d:
        bVar4 = false;
      }
      else {
        std::__shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  ((__shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2> *)&src,
                   &((p.super___shared_ptr<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                    dest).super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>);
        std::dynamic_pointer_cast<mocker::nasm::Register,mocker::nasm::Addr>
                  ((shared_ptr<mocker::nasm::Addr> *)&dest);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&src.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_70,
                   &((p.super___shared_ptr<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                    operand).super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>);
        std::dynamic_pointer_cast<mocker::nasm::Register,mocker::nasm::Addr>
                  ((shared_ptr<mocker::nasm::Addr> *)&src);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_70._M_refcount);
        bVar4 = false;
        bVar3 = true;
        if ((dest.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
             (element_type *)0x0) &&
           (src.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)0x0)) {
          _Var5 = std::operator==(&(dest.
                                    super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr)->identifier,
                                  &(src.
                                    super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr)->identifier);
          if (_Var5) {
            std::__cxx11::list<mocker::nasm::Line,std::allocator<mocker::nasm::Line>>::
            emplace_back<std::__cxx11::string_const&>
                      ((list<mocker::nasm::Line,std::allocator<mocker::nasm::Line>> *)&insts,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__args);
            bVar3 = false;
            bVar4 = true;
          }
        }
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&src.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&dest.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        if (bVar3) goto LAB_0012e55d;
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&p.super___shared_ptr<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      if (!bVar4) {
        std::__cxx11::list<mocker::nasm::Line,std::allocator<mocker::nasm::Line>>::
        emplace_back<std::__cxx11::string_const&,std::shared_ptr<mocker::nasm::Inst>&>
                  ((list<mocker::nasm::Line,std::allocator<mocker::nasm::Line>> *)&insts,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__args,
                   &newInst);
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&newInst.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
    }
    p_Var7 = p_Var7->_M_next;
  } while( true );
}

Assistant:

void RegisterAllocator::color(const RegMap<Node> &coloring) {
  std::list<nasm::Line> insts;
  for (auto iter = funcBeg; iter != funcEnd; ++iter) {
    auto &inst = iter->inst;
    if (!inst) {
      insts.emplace_back(*iter);
      continue;
    }
    auto newInst = nasm::replaceRegs(inst, coloring);
    if (auto p = nasm::dyc<nasm::Mov>(newInst)) {
      auto dest = nasm::dyc<nasm::Register>(p->getDest());
      auto src = nasm::dyc<nasm::Register>(p->getOperand());
      if (dest && src && dest->getIdentifier() == src->getIdentifier()) {
        insts.emplace_back(iter->label);
        continue;
      }
    }
    insts.emplace_back(iter->label, newInst);
  }

  funcBeg = funcEnd = section.erase(funcBeg, funcEnd);
  --funcBeg;
  for (auto &inst : insts) {
    section.appendLine(funcEnd, std::move(inst));
  }
  ++funcBeg;
}